

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equipartitionTest.cpp
# Opt level: O0

void __thiscall OpenMD::Equipartition::writeSequence(Equipartition *this)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  string *psVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  double *pdVar9;
  undefined8 uVar10;
  SequentialAnalyzer *in_RDI;
  uint i;
  Revision r;
  ofstream ofs;
  Revision *in_stack_fffffffffffffcb8;
  Revision *in_stack_fffffffffffffd08;
  uint local_25c;
  string local_258 [32];
  string local_238 [48];
  ostream local_208 [520];
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar2,_S_bin);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    uVar10 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"Equipartition::writeSequence Error: failed to open %s\n",uVar10);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar3 = std::operator<<(local_208,"# ");
    psVar4 = SequentialAnalyzer::getSequenceType_abi_cxx11_(in_RDI);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(local_208,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(in_stack_fffffffffffffd08);
    poVar3 = std::operator<<(poVar3,local_238);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_238);
    poVar3 = std::operator<<(local_208,"# ");
    Revision::getBuildDate_abi_cxx11_(in_stack_fffffffffffffcb8);
    poVar3 = std::operator<<(poVar3,local_258);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_258);
    poVar3 = std::operator<<(local_208,"# selection script1: \"");
    std::operator<<(poVar3,(string *)&in_RDI->selectionScript1_);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      poVar3 = std::operator<<(local_208,"# parameters: ");
      poVar3 = std::operator<<(poVar3,(string *)&in_RDI->paramString_);
      std::operator<<(poVar3,"\n");
    }
    std::operator<<(local_208,"#time\t Tpx\t Tpy \t Tpz \t Tjx \t Tjy \t Tjz\n");
    for (local_25c = 0; sVar6 = std::vector<double,_std::allocator<double>_>::size(&in_RDI->times_),
        local_25c < sVar6; local_25c = local_25c + 1) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->times_,(ulong)local_25c);
      poVar3 = (ostream *)std::ostream::operator<<(local_208,*pvVar7);
      poVar3 = std::operator<<(poVar3,"\t");
      pvVar8 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
               operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           *)(in_RDI + 1),(ulong)local_25c);
      pdVar9 = Vector3<double>::x(pvVar8);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar9);
      poVar3 = std::operator<<(poVar3,"\t");
      pvVar8 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
               operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           *)(in_RDI + 1),(ulong)local_25c);
      pdVar9 = Vector3<double>::y(pvVar8);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar9);
      poVar3 = std::operator<<(poVar3,"\t");
      pvVar8 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
               operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           *)(in_RDI + 1),(ulong)local_25c);
      pdVar9 = Vector3<double>::z(pvVar8);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar9);
      poVar3 = std::operator<<(poVar3,"\t");
      pvVar8 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
               operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           *)&in_RDI[1].dumpFilename_,(ulong)local_25c);
      pdVar9 = Vector3<double>::x(pvVar8);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar9);
      poVar3 = std::operator<<(poVar3,"\t");
      pvVar8 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
               operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           *)&in_RDI[1].dumpFilename_,(ulong)local_25c);
      pdVar9 = Vector3<double>::y(pvVar8);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar9);
      poVar3 = std::operator<<(poVar3,"\t");
      pvVar8 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
               operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           *)&in_RDI[1].dumpFilename_,(ulong)local_25c);
      pdVar9 = Vector3<double>::z(pvVar8);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar9);
      std::operator<<(poVar3,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void Equipartition::writeSequence() {
    std::ofstream ofs(outputFilename_.c_str(), std::ios::binary);

    if (ofs.is_open()) {
      Revision r;

      ofs << "# " << getSequenceType() << "\n";
      ofs << "# OpenMD " << r.getFullRevision() << "\n";
      ofs << "# " << r.getBuildDate() << "\n";
      ofs << "# selection script1: \"" << selectionScript1_;
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      ofs << "#time\t Tpx\t Tpy \t Tpz \t Tjx \t Tjy \t Tjz\n";

      for (unsigned int i = 0; i < times_.size(); ++i) {
        ofs << times_[i] << "\t" << TempP_[i].x() << "\t" << TempP_[i].y()
            << "\t" << TempP_[i].z() << "\t" << TempJ_[i].x() << "\t"
            << TempJ_[i].y() << "\t" << TempJ_[i].z() << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Equipartition::writeSequence Error: failed to open %s\n",
               outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    ofs.close();
  }